

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[6],char_const*,char[24],char_const*,char[29],char_const*,char[124]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [6],char **Args_1,
          char (*Args_2) [24],char **Args_3,char (*Args_4) [29],char **Args_5,char (*Args_6) [124])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [29];
  char **Args_local_3;
  char (*Args_local_2) [24];
  char **Args_local_1;
  char (*Args_local) [6];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[6],char_const*,char[24],char_const*,char[29],char_const*,char[124]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [6])this,(char **)Args,(char (*) [24])Args_1,(char **)Args_2,
             (char (*) [29])Args_3,(char **)Args_4,(char (*) [124])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}